

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::handle
          (SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,LeafData *ld,bool doInsert)

{
  anon_class_16_2_6aee48c9 bindSpecialVar;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *pDVar1;
  byte in_DL;
  undefined8 in_RSI;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *in_RDI;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  bindings;
  TypedTermList norm;
  LeafData *in_stack_000003f0;
  BindingMap *in_stack_000003f8;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *in_stack_00000400;
  Lhs *in_stack_fffffffffffffef8;
  Lhs *in_stack_ffffffffffffff00;
  undefined1 reversed;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this_00;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffff20;
  TypedTermList in_stack_ffffffffffffff28;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffff40;
  TypedTermList in_stack_ffffffffffffff88;
  undefined1 local_48 [32];
  TypedTermList local_28;
  byte local_11;
  
  reversed = (undefined1)((ulong)in_RSI >> 0x38);
  local_11 = in_DL & 1;
  local_48._16_16_ =
       (undefined1  [16])Inferences::ALASCA::Demodulation::Lhs::key(in_stack_ffffffffffffff00);
  local_28 = Kernel::Renaming::normalize(in_stack_ffffffffffffff88);
  this_00 = (SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *)local_48;
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)in_stack_ffffffffffffff00);
  bindSpecialVar.bindings = in_stack_ffffffffffffff20;
  bindSpecialVar.this = in_RDI;
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::handle(Inferences::ALASCA::Demodulation::Lhs,bool)::_lambda(int,auto:1)_1_>
            (this_00,in_stack_ffffffffffffff28,(bool)reversed,bindSpecialVar);
  if ((local_11 & 1) == 0) {
    pDVar1 = Lib::
             Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x370c29);
    Inferences::ALASCA::Demodulation::Lhs::Lhs(in_stack_ffffffffffffff00,(Lhs *)pDVar1);
    remove(in_RDI,(char *)pDVar1);
    Inferences::ALASCA::Demodulation::Lhs::~Lhs((Lhs *)0x370c5f);
  }
  else {
    pDVar1 = Lib::
             Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator*((Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x370ba6);
    Inferences::ALASCA::Demodulation::Lhs::Lhs((Lhs *)pDVar1,in_stack_fffffffffffffef8);
    insert(in_stack_00000400,in_stack_000003f8,in_stack_000003f0);
    Inferences::ALASCA::Demodulation::Lhs::~Lhs((Lhs *)0x370bde);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void handle(LeafData ld, bool doInsert)
    {
      auto norm = Renaming::normalize(ld.key());
      Recycled<BindingMap> bindings;
      createBindings(norm, /* reversed */ false,
          [&](int var, auto term) { 
            _nextVar = std::max(_nextVar, var + 1);
            bindings->insert(var, term);
          });
      if (doInsert) insert(*bindings, ld);
      else          remove(*bindings, ld);
    }